

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::ScaleLayerParams::_InternalSerialize
          (ScaleLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  bool bVar2;
  WeightParams *pWVar3;
  void *data;
  LogMessage *pLVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong *puVar10;
  undefined8 *puVar11;
  size_t __n;
  byte *pbVar12;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar9 = (this->_shapescale_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 10;
    pbVar12 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar12;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar12 = target + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar12 = (byte)uVar9;
    puVar10 = (ulong *)(this->shapescale_).arena_or_elements_;
    puVar1 = puVar10 + (this->shapescale_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = *puVar10;
      *target = (byte)uVar6;
      if (uVar6 < 0x80) {
        pbVar12 = target + 1;
      }
      else {
        *target = (byte)uVar6 | 0x80;
        target[1] = (byte)(uVar6 >> 7);
        pbVar12 = target + 2;
        if (0x3fff < uVar6) {
          uVar7 = (ulong)target[1];
          uVar6 = uVar6 >> 7;
          do {
            pbVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar6 >> 7;
            *pbVar12 = (byte)uVar5;
            pbVar12 = pbVar12 + 1;
            uVar7 = uVar5 & 0xffffffff;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar5;
          } while (bVar2);
        }
      }
      target = pbVar12;
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  if ((this != (ScaleLayerParams *)_ScaleLayerParams_default_instance_) &&
     (this->scale_ != (WeightParams *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pWVar3 = this->scale_;
    *target = 0x12;
    uVar9 = (pWVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (byte)uVar9;
    if (uVar9 < 0x80) {
      pbVar12 = target + 2;
    }
    else {
      pbVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar9,target + 1);
    }
    target = WeightParams::_InternalSerialize(pWVar3,pbVar12,stream);
  }
  if (this->hasbias_ == true) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar2 = this->hasbias_;
    *target = 0x18;
    target[1] = bVar2;
    target = target + 2;
  }
  uVar9 = (this->_shapebias_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_a1,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    *target = 0x22;
    pbVar12 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar12;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar12 = target + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar12 = (byte)uVar9;
    puVar10 = (ulong *)(this->shapebias_).arena_or_elements_;
    puVar1 = puVar10 + (this->shapebias_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = *puVar10;
      *target = (byte)uVar6;
      if (uVar6 < 0x80) {
        pbVar12 = target + 1;
      }
      else {
        *target = (byte)uVar6 | 0x80;
        target[1] = (byte)(uVar6 >> 7);
        pbVar12 = target + 2;
        if (0x3fff < uVar6) {
          uVar7 = (ulong)target[1];
          uVar6 = uVar6 >> 7;
          do {
            pbVar12[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar6 >> 7;
            *pbVar12 = (byte)uVar5;
            pbVar12 = pbVar12 + 1;
            uVar7 = uVar5 & 0xffffffff;
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar5;
          } while (bVar2);
        }
      }
      target = pbVar12;
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  if ((this != (ScaleLayerParams *)_ScaleLayerParams_default_instance_) &&
     (this->bias_ != (WeightParams *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pWVar3 = this->bias_;
    *target = 0x2a;
    uVar9 = (pWVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (byte)uVar9;
    if (uVar9 < 0x80) {
      pbVar12 = target + 2;
    }
    else {
      pbVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                          (uVar9,target + 1);
    }
    target = WeightParams::_InternalSerialize(pWVar3,pbVar12,stream);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffc) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar11 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar11 = (undefined8 *)((uVar6 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar11[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar11[1],target);
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* ScaleLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ScaleLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 shapeScale = 1;
  {
    int byte_size = _shapescale_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          1, _internal_shapescale(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams scale = 2;
  if (this->_internal_has_scale()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::scale(this), target, stream);
  }

  // bool hasBias = 3;
  if (this->_internal_hasbias() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_hasbias(), target);
  }

  // repeated uint64 shapeBias = 4;
  {
    int byte_size = _shapebias_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          4, _internal_shapebias(), byte_size, target);
    }
  }

  // .CoreML.Specification.WeightParams bias = 5;
  if (this->_internal_has_bias()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::bias(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ScaleLayerParams)
  return target;
}